

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int fits_translate_keyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int n_value,int n_offset,
              int n_range,int *pat_num,int *i,int *j,int *m,int *n,int *status)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  ushort **ppuVar11;
  ulong uVar12;
  char cVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  byte *pbVar18;
  byte bVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  byte local_8d;
  int local_88;
  int local_84;
  uint local_7c;
  
  if (0 < *status) {
    return *status;
  }
  if (inrec == (char *)0x0 || outrec == (char *)0x0) {
    *status = 0x73;
    return 0x73;
  }
  *outrec = '\0';
  if (*inrec == '\0') {
    builtin_strncpy(inrec,"        ",9);
  }
  uVar20 = 0;
  uVar12 = (ulong)(uint)npat;
  if (npat < 1) {
    uVar12 = uVar20;
  }
  local_8d = 0x20;
  local_84 = 0;
  local_88 = 0;
  uVar21 = 0;
  local_7c = 0;
  bVar9 = 0;
  bVar4 = false;
  bVar5 = false;
  do {
    if (uVar20 == uVar12) {
      bVar4 = !bVar4;
LAB_00131f33:
      if (i != (int *)0x0) {
        *i = local_84;
      }
      if (j != (int *)0x0) {
        *j = local_88;
      }
      if (n != (int *)0x0) {
        *n = uVar21;
      }
      if (m != (int *)0x0) {
        *m = local_7c;
      }
      if (pat_num != (int *)0x0) {
        *pat_num = (int)uVar12;
      }
      if (bVar4) {
        return 0;
      }
      pbVar2 = (byte *)patterns[uVar12 & 0xffffffff][1];
      bVar9 = *pbVar2;
      if (bVar9 == 0) {
        return (uint)bVar9;
      }
      if (bVar9 == 0x2d) {
        if ((pbVar2[1] == 0x2d) && (pbVar2[2] == 0)) {
          outrec[0] = '-';
          outrec[1] = '\0';
          strncat(outrec,inrec,8);
          outrec[9] = '\0';
          uVar21 = 8;
          while( true ) {
            if (uVar21 < 2) {
              return 0;
            }
            if (outrec[uVar21] != ' ') break;
            outrec[uVar21] = '\0';
            uVar21 = uVar21 - 1;
          }
          return 0;
        }
        if (pbVar2[1] == 0) {
          return 0;
        }
      }
      strcpy(outrec,inrec);
      bVar9 = *pbVar2;
      if (bVar9 == 0x2b) {
        return 0;
      }
      lVar16 = 0;
      iVar15 = 0;
      do {
        cVar13 = (char)local_84;
        if ((bVar9 == 0x69) || (cVar13 = (char)local_88, bVar9 == 0x6a)) {
          outrec[iVar15] = cVar13 + '0';
        }
        else if (bVar9 == 0x6e) {
          if (uVar21 == 0xffffffff) {
            uVar21 = n_value;
          }
          if (0 < (int)uVar21) {
            uVar21 = uVar21 + n_offset;
            for (uVar12 = 1; 0 < (int)uVar21 / (int)uVar12; uVar12 = (ulong)(uint)((int)uVar12 * 10)
                ) {
            }
            lVar23 = (long)iVar15;
            iVar15 = iVar15 + -1;
            pcVar17 = outrec + lVar23;
            while (9 < (uint)uVar12) {
              uVar12 = uVar12 / 10;
              uVar20 = (long)(int)uVar21 / (long)(int)uVar12;
              *pcVar17 = (char)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 |
                                      uVar20 & 0xffffffff) % 10) + '0';
              iVar15 = iVar15 + 1;
              pcVar17 = pcVar17 + 1;
            }
          }
        }
        else {
          lVar23 = (long)iVar15;
          if (bVar9 == 0) {
            for (; lVar23 < 8; lVar23 = lVar23 + 1) {
              outrec[lVar23] = ' ';
            }
            return *status;
          }
          if ((bVar9 == 0x6d) && (-1 < (int)local_7c)) {
            for (uVar12 = 1; 0 < (int)(local_7c / uVar12); uVar12 = (ulong)(uint)((int)uVar12 * 10))
            {
            }
            iVar15 = iVar15 + -1;
            pbVar18 = (byte *)(outrec + lVar23);
            while (9 < (uint)uVar12) {
              uVar12 = uVar12 / 10;
              *pbVar18 = (byte)((local_7c / uVar12) % 10) | 0x30;
              iVar15 = iVar15 + 1;
              pbVar18 = pbVar18 + 1;
            }
          }
          else {
            if (bVar9 == 0x61) {
              bVar9 = local_8d;
            }
            outrec[lVar23] = bVar9;
          }
        }
        iVar15 = iVar15 + 1;
        bVar9 = pbVar2[lVar16 + 1];
        lVar16 = lVar16 + 1;
      } while( true );
    }
    pbVar2 = (byte *)patterns[uVar20][0];
    bVar1 = *pbVar2;
    if (bVar1 == 0x2a) {
      local_8d = 0x20;
      local_7c = 0xffffffff;
      local_84 = 0;
      uVar12 = uVar20 & 0xffffffff;
      local_88 = 0;
      bVar4 = false;
      uVar21 = local_7c;
      goto LAB_00131f33;
    }
    local_7c = 0xffffffff;
    if ((bVar5) && (bVar1 == bVar9)) {
      local_84 = 0;
      local_8d = 0x20;
      local_88 = 0;
      uVar21 = 0xffffffff;
      bVar4 = false;
      bVar5 = true;
    }
    else {
      bVar4 = true;
      local_8d = 0x20;
      lVar16 = 0;
      local_84 = 0;
      local_88 = 0;
      uVar21 = 0xffffffff;
      bVar5 = true;
      bVar14 = bVar1;
      for (iVar15 = 0; (lVar23 = (long)iVar15, bVar9 = bVar1, bVar14 != 0 && (iVar15 < 8));
          iVar15 = iVar15 + 1) {
        bVar19 = inrec[lVar23];
        lVar22 = (long)(char)bVar19;
        uVar3 = (uint)bVar14;
        bVar6 = local_8d;
        uVar7 = local_7c;
        uVar8 = uVar21;
        if ((uVar3 - 0x6d < 2) || (uVar3 == 0x23)) {
          ppuVar11 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar11 + lVar22 * 2 + 1) & 8) == 0) goto LAB_00131ebe;
          iVar15 = iVar15 + -1;
          uVar10 = 0;
          for (; lVar23 < 8; lVar23 = lVar23 + 1) {
            if ((*(byte *)((long)*ppuVar11 + (long)(char)bVar19 * 2 + 1) & 8) == 0)
            goto LAB_00131d0e;
            uVar10 = (uVar10 * 10 + (int)(char)bVar19) - 0x30;
            bVar19 = inrec[lVar23 + 1];
            iVar15 = iVar15 + 1;
          }
          iVar15 = 7;
LAB_00131d0e:
          uVar7 = uVar10;
          if ((bVar14 != 0x6d) && (uVar7 = local_7c, uVar3 == 0x6e)) {
            if (0x3e6 < uVar10 - 1) goto LAB_00131ebe;
            uVar8 = uVar10;
            if (((uVar10 != n_value || n_range != 0) && (n_range != -1 || n_value < (int)uVar10)) &&
               (n_range != 1 || (int)uVar10 < n_value)) goto LAB_00131ebe;
          }
        }
        else if (uVar3 != 0x3f) {
          if (uVar3 == 0x61) {
            ppuVar11 = __ctype_b_loc();
            bVar6 = bVar19;
            if (((*(byte *)((long)*ppuVar11 + lVar22 * 2 + 1) & 1) == 0) && (bVar19 != 0x20)) {
LAB_00131de9:
              bVar6 = local_8d;
              if (bVar4) goto LAB_00131ebe;
            }
          }
          else if (uVar3 == 0x6a) {
            ppuVar11 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar11 + lVar22 * 2 + 1) & 8) == 0) goto LAB_00131de9;
            local_88 = (char)bVar19 + -0x30;
          }
          else if (uVar3 == 0x69) {
            ppuVar11 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar11 + lVar22 * 2 + 1) & 8) == 0) goto LAB_00131de9;
            local_84 = (char)bVar19 + -0x30;
          }
          else if (bVar19 != bVar14) goto LAB_00131ebe;
        }
        uVar21 = uVar8;
        local_7c = uVar7;
        local_8d = bVar6;
        bVar14 = pbVar2[lVar16 + 1];
        lVar16 = lVar16 + 1;
        bVar4 = false;
        bVar5 = false;
      }
      if (bVar4) {
LAB_00131ebe:
        bVar4 = false;
      }
      else {
        if (7 < iVar15) {
          bVar4 = false;
          uVar12 = uVar20;
          goto LAB_00131f33;
        }
        if (inrec[lVar23] == ' ') {
          bVar4 = false;
          uVar12 = uVar20 & 0xffffffff;
          goto LAB_00131f33;
        }
        bVar4 = true;
      }
    }
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

int fits_translate_keyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int n_value,        /* I - base 'n' template value of interest */
      int n_offset,       /* I - offset to be applied to the 'n' */
                          /*     value in the output string */
      int n_range,        /* I - controls range of 'n' template */
                          /*     values of interest (-1,0, or +1) */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,             /* O - value of i, if any, else 0 */
      int *j,             /* O - value of j, if any, else 0 */
      int *m,             /* O - value of m, if any, else 0 */
      int *n,             /* O - value of n, if any, else 0 */

      int *status)        /* IO - error status */

/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n - column number of one or more digits, preserved in output template
     m - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

  This routine was written by Craig Markwardt, GSFC
*/

{
    int i1 = 0, j1 = 0, n1 = 0, m1 = 0;
    int fac;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);
    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
/*
    if (*inrec == '\0') return 0;
*/

    if (*inrec == '\0')    /* expand to full 8 char blank keyword name */
       strcpy(inrec, "        ");
       
    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {
      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0; m1 = -1; n1 = -1; a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == '#')) {
	  /* Special patterns: multi-digit number */
	  int val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];
	    
	    if (s == 'n') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999 &&                    /* Row range check */
		   (((n_range == 0) && (val == n_value)) ||     /* Strict equality */
		    ((n_range == -1) && (val <= n_value)) ||    /* n <= n_value */
		    ((n_range == +1) && (val >= n_value))) ) {  /* n >= n_value */
		n1 = val;
	      } else {
		pass = 0;
	      }
	    } else if (s == 'm') {
	      
	      /* Generic number */
	      m1 = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	if (!pass) break;
      }
      
      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }

    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = n1; }
    if (m) { *m = m1; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: explicit deletion, return '-' */
    if (pass && strcmp(spat,"--") == 0) {
      strcpy(outrec, "-");
      strncat(outrec, inrec, 8);
      outrec[9] = 0;
      for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;
      return 0;
    }

    /* Return case: no match, or do-not-transfer pattern */
    if (pass == 0 || spat[0] == '\0' || strcmp(spat,"-") == 0) return 0;
    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;


    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n') {
	if (n1 == -1) { n1 = n_value; }
	if (n1 > 0) {
	  n1 += n_offset;
	  for (fac = 1; (n1/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((n1/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
	}
      } else if (s == 'm' && m1 >= 0) {
	for (fac = 1; (m1/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((m1/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}